

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O0

void opj_mct_decode(OPJ_INT32 *c0,OPJ_INT32 *c1,OPJ_INT32 *c2,OPJ_SIZE_T n)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  undefined1 auVar9 [16];
  OPJ_INT32 b_1;
  OPJ_INT32 r_1;
  OPJ_INT32 g_1;
  OPJ_INT32 v_1;
  OPJ_INT32 u_1;
  OPJ_INT32 y_1;
  __m128i v;
  __m128i u;
  __m128i y;
  __m128i b;
  __m128i g;
  __m128i r;
  OPJ_SIZE_T len;
  OPJ_SIZE_T i;
  OPJ_SIZE_T n_local;
  OPJ_INT32 *c2_local;
  OPJ_INT32 *c1_local;
  OPJ_INT32 *c0_local;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  
  for (len = 0; len < (n & 0xfffffffc); len = len + 4) {
    uVar2 = *(undefined8 *)(c0 + len);
    uVar3 = *(undefined8 *)(c0 + len + 2);
    uVar4 = *(undefined8 *)(c1 + len);
    uVar5 = *(undefined8 *)(c1 + len + 2);
    uVar6 = *(undefined8 *)(c2 + len);
    uVar7 = *(undefined8 *)(c2 + len + 2);
    local_b8 = (int)uVar4;
    iStack_b4 = (int)((ulong)uVar4 >> 0x20);
    iStack_b0 = (int)uVar5;
    iStack_ac = (int)((ulong)uVar5 >> 0x20);
    local_c8 = (int)uVar6;
    iStack_c4 = (int)((ulong)uVar6 >> 0x20);
    iStack_c0 = (int)uVar7;
    iStack_bc = (int)((ulong)uVar7 >> 0x20);
    auVar9 = ZEXT416(2);
    local_78 = (int)uVar2;
    iStack_74 = (int)((ulong)uVar2 >> 0x20);
    iStack_70 = (int)uVar3;
    iStack_6c = (int)((ulong)uVar3 >> 0x20);
    local_78 = local_78 - (local_b8 + local_c8 >> auVar9);
    iStack_74 = iStack_74 - (iStack_b4 + iStack_c4 >> auVar9);
    iStack_70 = iStack_70 - (iStack_b0 + iStack_c0 >> auVar9);
    iStack_6c = iStack_6c - (iStack_ac + iStack_bc >> auVar9);
    b[1] = CONCAT44(iStack_74,local_78);
    g[0] = CONCAT44(iStack_6c,iStack_70);
    *(ulong *)(c0 + len) = CONCAT44(iStack_c4 + iStack_74,local_c8 + local_78);
    *(ulong *)(c0 + len + 2) = CONCAT44(iStack_bc + iStack_6c,iStack_c0 + iStack_70);
    *(longlong *)(c1 + len) = b[1];
    *(longlong *)((long)(c1 + len) + 8) = g[0];
    *(ulong *)(c2 + len) = CONCAT44(iStack_b4 + iStack_74,local_b8 + local_78);
    *(ulong *)(c2 + len + 2) = CONCAT44(iStack_ac + iStack_6c,iStack_b0 + iStack_70);
  }
  for (; len < n; len = len + 1) {
    iVar1 = c1[len];
    iVar8 = c0[len] - (iVar1 + c2[len] >> 2);
    c0[len] = c2[len] + iVar8;
    c1[len] = iVar8;
    c2[len] = iVar1 + iVar8;
  }
  return;
}

Assistant:

void opj_mct_decode(
    OPJ_INT32* OPJ_RESTRICT c0,
    OPJ_INT32* OPJ_RESTRICT c1,
    OPJ_INT32* OPJ_RESTRICT c2,
    OPJ_SIZE_T n)
{
    OPJ_SIZE_T i;
    const OPJ_SIZE_T len = n;

    for (i = 0; i < (len & ~3U); i += 4) {
        __m128i r, g, b;
        __m128i y = _mm_load_si128((const __m128i *) & (c0[i]));
        __m128i u = _mm_load_si128((const __m128i *) & (c1[i]));
        __m128i v = _mm_load_si128((const __m128i *) & (c2[i]));
        g = y;
        g = _mm_sub_epi32(g, _mm_srai_epi32(_mm_add_epi32(u, v), 2));
        r = _mm_add_epi32(v, g);
        b = _mm_add_epi32(u, g);
        _mm_store_si128((__m128i *) & (c0[i]), r);
        _mm_store_si128((__m128i *) & (c1[i]), g);
        _mm_store_si128((__m128i *) & (c2[i]), b);
    }
    for (; i < len; ++i) {
        OPJ_INT32 y = c0[i];
        OPJ_INT32 u = c1[i];
        OPJ_INT32 v = c2[i];
        OPJ_INT32 g = y - ((u + v) >> 2);
        OPJ_INT32 r = v + g;
        OPJ_INT32 b = u + g;
        c0[i] = r;
        c1[i] = g;
        c2[i] = b;
    }
}